

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QModelIndex * __thiscall
QTreeViewPrivate::modelIndex
          (QModelIndex *__return_storage_ptr__,QTreeViewPrivate *this,int i,int column)

{
  QTreeViewItem *pQVar1;
  ulong uVar2;
  quintptr qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QModelIndex local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((i < 0) || (uVar2 = (ulong)(uint)i, (ulong)(this->viewItems).d.size <= uVar2)) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
  }
  else {
    pQVar1 = (this->viewItems).d.ptr;
    (__return_storage_ptr__->m).ptr = pQVar1[uVar2].index.m.ptr;
    pQVar1 = pQVar1 + uVar2;
    iVar4 = (pQVar1->index).c;
    qVar3 = (pQVar1->index).i;
    __return_storage_ptr__->r = (pQVar1->index).r;
    __return_storage_ptr__->c = iVar4;
    __return_storage_ptr__->i = qVar3;
    if (column != 0) {
      QModelIndex::sibling(&local_30,__return_storage_ptr__,__return_storage_ptr__->r,column);
      (__return_storage_ptr__->m).ptr = local_30.m.ptr;
      __return_storage_ptr__->r = local_30.r;
      __return_storage_ptr__->c = local_30.c;
      __return_storage_ptr__->i = local_30.i;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QTreeViewPrivate::modelIndex(int i, int column) const
{
    if (i < 0 || i >= viewItems.size())
        return QModelIndex();

    QModelIndex ret = viewItems.at(i).index;
    if (column)
        ret = ret.sibling(ret.row(), column);
    return ret;
}